

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O2

ssize_t __thiscall rudp::session::send(session *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte at;
  byte bVar6;
  uint8_t uVar7;
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  *pvVar8;
  ulong uVar9;
  element_type *peVar10;
  stored_size_type sVar11;
  function<void_(bool)> *pfVar12;
  bool bVar13;
  uint16_t uVar14;
  int iVar15;
  reference puVar16;
  byte *pbVar17;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  undefined8 uVar18;
  function<void_(bool)> *cb_1;
  function<void_(bool)> *this_00;
  ulong uVar19;
  undefined4 in_register_00000034;
  buffer_ptr_t *__args;
  session *this_01;
  __shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  *this_02;
  long lVar20;
  vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> cbs;
  pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
  local_68;
  
  __args = (buffer_ptr_t *)CONCAT44(in_register_00000034,__fd);
  pvVar8 = &((__args->
             super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  if (pvVar8 == (vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                 *)0x0) {
    std::function<void_(bool)>::operator()((function<void_(bool)> *)__n,false);
    return extraout_RAX;
  }
  puVar16 = boost::container::
            vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
            ::operator[](pvVar8,0);
  uVar1 = *puVar16;
  pbVar17 = boost::container::
            vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
            ::operator[](&((__args->
                           super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->
                          super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                         ,0);
  bVar2 = *pbVar17;
  pbVar17 = boost::container::
            vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
            ::operator[](&((__args->
                           super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->
                          super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                         ,0);
  bVar3 = *pbVar17;
  pbVar17 = boost::container::
            vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
            ::operator[](&((__args->
                           super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->
                          super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                         ,0);
  cbs.super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cbs.super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cbs.super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((((char)__buf == '\0') && (this->state != opened)) && (-1 < (char)uVar1)) &&
     ((*pbVar17 & 2) == 0)) {
    std::function<void_(bool)>::operator()((function<void_(bool)> *)__n,false);
  }
  else {
    bVar13 = generate_eak(this);
    if (bVar13) {
      this_01 = (session *)
                (__args->
                super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      pbVar17 = boost::container::
                vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                ::operator[]((vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                              *)this_01,0);
      bVar4 = *pbVar17;
      bVar13 = check_common_header(this_01,__args);
      if (!bVar13) {
        uVar18 = __cxa_allocate_exception(1);
        __cxa_throw(uVar18,&invalid_packet::typeinfo,0);
      }
      pbVar17 = boost::container::
                vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                ::operator[](&((__args->
                               super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->
                              super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                             ,1);
      bVar5 = *pbVar17;
      uVar19 = (ulong)bVar5;
      uVar9 = (((__args->
                super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->
              super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
              ).m_holder.m_size;
      if ((uVar9 < uVar19) || (bVar5 < 4)) {
        uVar18 = __cxa_allocate_exception(1);
        __cxa_throw(uVar18,&invalid_packet::typeinfo,0);
      }
      if ((char)uVar1 < '\0') {
        this_02 = (__shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                   *)&this->send_buffer;
        for (lVar20 = 0x3000; lVar20 != 0; lVar20 = lVar20 + -0x30) {
          if (this_02->_M_ptr != (element_type *)0x0) {
            std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::
            push_back(&cbs,(value_type *)(this_02 + 1));
          }
          local_68.first.
          super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_68.first.
          super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          __shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
          ::operator=(this_02,(__shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                               *)&local_68);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_68.first.
                      super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          this_02 = this_02 + 3;
        }
        iVar15 = rand();
        this->send_head = (uint8_t)iVar15;
        this->acknowledge_head = (uint8_t)iVar15;
        peVar10 = (__args->
                  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        session_config::session_config
                  ((session_config *)&local_68,
                   (uchar *)((long)(peVar10->
                                   super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                                   ).m_holder.
                                   super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.
                                   storage.aligner.data + 4),
                   (uint8_t *)((long)peVar10 + (uVar19 - 2)));
        (this->self_config).connection_identifier =
             local_68.second.super__Function_base._M_functor._0_4_;
        *(element_type **)&this->self_config =
             local_68.first.
             super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         &(this->self_config).null_segment_timeout_value =
             local_68.first.
             super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        this->state = opened;
      }
      if ((bVar2 & 0x10) != 0) {
        this->state = closed;
      }
      at = this->send_head;
      this->send_head = at + 1;
      pvVar8 = &((__args->
                 super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->
                super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
      ;
      sVar11 = (pvVar8->m_holder).m_size;
      pbVar17 = boost::container::
                vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                ::operator[](pvVar8,0);
      bVar6 = *pbVar17;
      pbVar17 = boost::container::
                vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                ::operator[](&((__args->
                               super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->
                              super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                             ,0);
      *pbVar17 = (sVar11 != uVar19) << 2 | bVar6 & 0xfb;
      pbVar17 = boost::container::
                vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                ::operator[](&((__args->
                               super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->
                              super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                             ,2);
      *pbVar17 = at;
      if ((bVar4 & 0x40) != 0) {
        uVar7 = this->receive_head;
        puVar16 = boost::container::
                  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                  ::operator[](&((__args->
                                 super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->
                                super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                               ,3);
        *puVar16 = uVar7 + 0xff;
      }
      std::
      pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
      ::
      pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>,_true>
                (&local_68,__args,(function<void_(bool)> *)__n);
      std::
      pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
      ::operator=((this->send_buffer)._M_elems + at,&local_68);
      std::
      pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
      ::~pair(&local_68);
      *(undefined2 *)
       ((long)&(((__args->
                 super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->
               super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
               ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage +
       (ulong)(bVar5 - 2)) = 0;
      peVar10 = (__args->
                super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      uVar14 = checksum((uint8_t *)peVar10,
                        (peVar10->
                        super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                        ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.
                        storage.data +
                        (peVar10->
                        super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                        ).m_holder.m_size);
      *(uint16_t *)
       ((long)&(((__args->
                 super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->
               super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
               ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage +
       (ulong)(bVar5 - 2)) = uVar14 << 8 | uVar14 >> 8;
      send_packet(this,__args,(send_cb_t *)__n);
      this->unacknowledged_packet_count = this->unacknowledged_packet_count + 1;
      reset_cumulative_ack_counter(this);
      set_null_segment_timer(this);
      this_00 = cbs.
                super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pfVar12 = cbs.
                super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((byte)((bVar2 & 0x10) >> 4 | (bVar3 & 8) >> 3 | uVar9 != uVar19) == 1) {
        set_retransmission_timer(this,at);
        this_00 = cbs.
                  super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pfVar12 = cbs.
                  super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; this_00 != pfVar12; this_00 = this_00 + 1) {
        std::function<void_(bool)>::operator()(this_00,false);
      }
    }
    else {
      std::
      deque<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>>>
      ::
      emplace_back<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const&,std::function<void(bool)>const&>
                ((deque<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>>>
                  *)&this->pending,__args,(function<void_(bool)> *)__n);
    }
  }
  std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::~vector
            (&cbs);
  return extraout_RAX_00;
}

Assistant:

void session::send( const buffer_ptr_t &incoming, bool resend, const send_cb_t &cb ) {
    if( !incoming ) {
      cb( false );
      return;
    }
    const bool syn = (*incoming)[ 0 ] & 0x80;
    const bool rst = (*incoming)[ 0 ] & 0x10;
    const bool nul = (*incoming)[ 0 ] & 0x08;
    const bool tcs = (*incoming)[ 0 ] & 0x02;
    std::vector< send_cb_t > cbs;
    if( !resend && state != session_state::opened && !syn && !tcs ) {
      cb( false );
      return;
    }
    if( !ready_to_send() ) {
      pending.emplace( incoming, cb );
      return;
    }
    const bool ack = (*incoming)[ 0 ] & 0x40;
    if( !check_common_header( incoming ) ) throw invalid_packet();
    const auto header_size = (*incoming)[ 1 ];
    if( header_size > incoming->size() ) throw invalid_packet();
    if( header_size < 4 ) throw invalid_packet();
    bool has_data = header_size != incoming->size();
    if( syn ) {
      std::for_each( send_buffer.begin(), send_buffer.end(), [&]( auto &v ) {
        if( v.first ) cbs.push_back( v.second );
        v.first = buffer_ptr_t();
      } );
      send_head = rand();
      acknowledge_head = send_head;
      self_config = session_config( std::next( incoming->data(), 4 ), std::next( incoming->data(), header_size - 2 ) );
      state = session_state::opened;
    }
    if( rst ) {
      state = session_state::closed;
    }
    const auto sequence_number = send_head++;
    if( header_size != incoming->size() ) (*incoming)[ 0 ] = (*incoming)[ 0 ] | 0x04;
    else (*incoming)[ 0 ] = (*incoming)[ 0 ] & 0xFB;
    (*incoming)[ 2 ] = sequence_number;
    if( ack )  (*incoming)[ 3 ] = receive_head - 1;
    send_buffer[ sequence_number ] = std::make_pair( incoming, cb );
    to_be16( std::next( incoming->data(), header_size - 2 ), 0 );
    const auto sum = rudp::checksum( incoming->data(), std::next( incoming->data(), incoming->size() ) );
    to_be16( std::next( incoming->data(), header_size - 2 ), sum );
    send_packet( incoming, cb );
    ++unacknowledged_packet_count;
    reset_cumulative_ack_counter();
    set_null_segment_timer();
    if( has_data || nul || rst ) {
      //clear_retransmission_timer( sequence_number, sequence_number + 1u );
      set_retransmission_timer( sequence_number );
    }
    for( auto &cb: cbs ) {
      cb( false );
    }
  }